

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

void __thiscall libcalc::Token::Token(Token *this,char symbol)

{
  char symbol_local;
  Token *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->type = '\0';
  push(this,symbol);
  return;
}

Assistant:

Token::Token(const char symbol) {
  push(symbol);
}